

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EmissionSystem::~EmissionSystem(EmissionSystem *this)

{
  ~EmissionSystem(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

EmissionSystem::~EmissionSystem()
{
    m_vEmitterBeams.clear();
}